

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

ArrayBuilder<capnp::compiler::CompilerMain::OutputDirective> * __thiscall
kj::ArrayBuilder<capnp::compiler::CompilerMain::OutputDirective>::operator=
          (ArrayBuilder<capnp::compiler::CompilerMain::OutputDirective> *this,
          ArrayBuilder<capnp::compiler::CompilerMain::OutputDirective> *other)

{
  ArrayBuilder<capnp::compiler::CompilerMain::OutputDirective> *other_local;
  ArrayBuilder<capnp::compiler::CompilerMain::OutputDirective> *this_local;
  
  dispose(this);
  this->ptr = other->ptr;
  this->pos = other->pos;
  this->endPtr = other->endPtr;
  this->disposer = other->disposer;
  other->ptr = (OutputDirective *)0x0;
  other->pos = (RemoveConst<capnp::compiler::CompilerMain::OutputDirective> *)0x0;
  other->endPtr = (OutputDirective *)0x0;
  return this;
}

Assistant:

ArrayBuilder& operator=(ArrayBuilder&& other) {
    dispose();
    ptr = other.ptr;
    pos = other.pos;
    endPtr = other.endPtr;
    disposer = other.disposer;
    other.ptr = nullptr;
    other.pos = nullptr;
    other.endPtr = nullptr;
    return *this;
  }